

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O1

List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *
Lib::List<Inferences::ALASCA::BinaryResolutionConf::Lhs>::cons
          (Lhs *elem,List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *l)

{
  bool bVar1;
  Clause *pCVar2;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *pLVar3;
  byte bVar4;
  undefined4 uVar5;
  undefined8 uVar7;
  undefined4 in_R8D;
  List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *pLVar6;
  
  uVar7 = 0xb7e180;
  pLVar6 = l;
  pLVar3 = (List<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)
           FixedSizeAllocator<64UL>::alloc
                     ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  uVar5 = SUB84(pLVar6,0);
  bVar1 = (elem->super_SelectedLiteral).interpreted.
          super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ._isSome;
  if (bVar1 == true) {
    bVar4 = *(byte *)&(elem->super_SelectedLiteral).interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem & 3;
    uVar5 = *(undefined4 *)
             ((long)&(elem->super_SelectedLiteral).interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 1);
    uVar7 = *(undefined8 *)
             ((long)&(elem->super_SelectedLiteral).interpreted.
                     super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                     ._elem._elem + 9);
    in_R8D = *(undefined4 *)
              ((long)&(elem->super_SelectedLiteral).interpreted.
                      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                      ._elem._elem + 0x11);
  }
  else {
    bVar4 = 0;
  }
  pCVar2 = (elem->super_SelectedLiteral).cl;
  (pLVar3->_head).super_SelectedLiteral.litIdx = (elem->super_SelectedLiteral).litIdx;
  (pLVar3->_head).super_SelectedLiteral.cl = pCVar2;
  (pLVar3->_head).super_SelectedLiteral.interpreted.
  super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  ._isSome = bVar1;
  if (bVar1 != false) {
    *(undefined8 *)
     &(pLVar3->_head).super_SelectedLiteral.interpreted.
      super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
      ._elem._elem = 0;
    *(undefined8 *)
     ((long)&(pLVar3->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 8) = 0;
    *(undefined8 *)
     ((long)&(pLVar3->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0xc) = 0;
    *(undefined8 *)
     ((long)&(pLVar3->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0x14) = 0;
    *(byte *)&(pLVar3->_head).super_SelectedLiteral.interpreted.
              super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
              ._elem._elem = bVar4;
    *(undefined4 *)
     ((long)&(pLVar3->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 1) = uVar5;
    *(undefined8 *)
     ((long)&(pLVar3->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 9) = uVar7;
    *(undefined4 *)
     ((long)&(pLVar3->_head).super_SelectedLiteral.interpreted.
             super_OptionBase<Lib::Coproduct<Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::AlascaLiteral<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
             ._elem._elem + 0x11) = in_R8D;
  }
  pLVar3->_tail = l;
  return pLVar3;
}

Assistant:

static List* cons(C elem, List* l)
  {
    return new List(elem, l);
  }